

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::ListBoxFooter(void)

{
  ImGuiWindow *pIVar1;
  ImGuiStyle *pIVar2;
  ImGuiStyle *style;
  ImRect bb;
  ImGuiWindow *parent_window;
  ImGuiWindow *window;
  
  pIVar1 = GetCurrentWindow();
  if ((pIVar1->Flags & 0x1000000U) == 0) {
    __assert_fail("(window->Flags & ImGuiWindowFlags_ChildWindow) && \"Mismatched ListBoxHeader/ListBoxFooter calls. Did you test the return value of ListBoxHeader()?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_widgets.cpp"
                  ,0x181d,"void ImGui::ListBoxFooter()");
  }
  bb.Max = (ImVec2)pIVar1->ParentWindow;
  style = *(ImGuiStyle **)&((ImRect *)((long)bb.Max + 300))->Min;
  bb.Min = *(ImVec2 *)((long)bb.Max + 0x134);
  pIVar2 = GetStyle();
  EndChildFrame();
  SameLine(0.0,-1.0);
  *(ImGuiStyle **)((long)bb.Max + 0xd8) = style;
  ItemSize((ImRect *)&style,(pIVar2->FramePadding).y);
  EndGroup();
  return;
}

Assistant:

void ImGui::ListBoxFooter()
{
    ImGuiWindow * window = GetCurrentWindow();
    IM_ASSERT((window->Flags & ImGuiWindowFlags_ChildWindow) && "Mismatched ListBoxHeader/ListBoxFooter calls. Did you test the return value of ListBoxHeader()?");
    ImGuiWindow* parent_window = window->ParentWindow;
    const ImRect bb = parent_window->DC.LastItemRect;
    const ImGuiStyle& style = GetStyle();

    EndChildFrame();

    // Redeclare item size so that it includes the label (we have stored the full size in LastItemRect)
    // We call SameLine() to restore DC.CurrentLine* data
    SameLine();
    parent_window->DC.CursorPos = bb.Min;
    ItemSize(bb, style.FramePadding.y);
    EndGroup();
}